

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store_array_binary<float>
          (XMLWriter *this,char *name,vector<float,_std::allocator<float>_> *vec)

{
  ostream *poVar1;
  streamoff sVar2;
  size_type sVar3;
  char *pcVar4;
  float *pfVar5;
  vector<float,_std::allocator<float>_> *in_RDX;
  char *in_RSI;
  long in_RDI;
  streampos offset;
  XMLWriter *in_stack_ffffffffffffffb0;
  fpos local_28 [16];
  vector<float,_std::allocator<float>_> *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = (fpos  [16])std::istream::tellg();
  tab(in_stack_ffffffffffffffb0);
  poVar1 = std::operator<<((ostream *)(in_RDI + 0x10),"<");
  poVar1 = std::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1," ofs=\"");
  sVar2 = std::fpos::operator_cast_to_long(local_28);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  poVar1 = std::operator<<(poVar1,"\" size=\"");
  sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar3);
  poVar1 = std::operator<<(poVar1,"\"/>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  sVar3 = std::vector<float,_std::allocator<float>_>::size(local_18);
  if (sVar3 != 0) {
    pcVar4 = (char *)(in_RDI + 0x220);
    pfVar5 = std::vector<float,_std::allocator<float>_>::data
                       ((vector<float,_std::allocator<float>_> *)0x3fb481);
    std::vector<float,_std::allocator<float>_>::size(local_18);
    std::ostream::write(pcVar4,(long)pfVar5);
  }
  return;
}

Assistant:

void XMLWriter::store_array_binary(const char* name, const std::vector<T>& vec)
  {
    std::streampos offset = bin.tellg();
    tab(); xml << "<" << name << " ofs=\"" << offset << "\" size=\"" << vec.size() << "\"/>" << std::endl;
    if (vec.size()) bin.write((char*)vec.data(),vec.size()*sizeof(T));
  }